

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_dump_listener.c
# Opt level: O2

void ht_file_dump_listener_callback
               (TEventPtr events,size_t size,HT_Boolean serialized,void *user_data)

{
  ht_mutex_lock(*(HT_Mutex **)((long)user_data + 0x20));
  if (*(long *)((long)user_data + 0x18) != 0) {
    if (serialized == 0) {
      ht_listener_buffer_process_unserialized_events
                ((HT_ListenerBuffer *)user_data,events,size,_ht_file_dump_listener_flush,user_data);
    }
    else {
      ht_listener_buffer_process_serialized_events
                ((HT_ListenerBuffer *)user_data,events,size,_ht_file_dump_listener_flush,user_data);
    }
  }
  ht_mutex_unlock(*(HT_Mutex **)((long)user_data + 0x20));
  return;
}

Assistant:

void
ht_file_dump_listener_callback(TEventPtr events, size_t size, HT_Boolean serialized, void* user_data)
{
    HT_FileDumpListener* listener = (HT_FileDumpListener*)user_data;

    ht_mutex_lock(listener->mtx);

    if (_ht_file_dump_listener_is_stopped(listener))
    {
        ht_mutex_unlock(listener->mtx);
        return;
    }

    if (serialized)
    {
        ht_listener_buffer_process_serialized_events(&listener->buffer, events, size, _ht_file_dump_listener_flush, listener);
    }
    else
    {
        ht_listener_buffer_process_unserialized_events(&listener->buffer, events, size, _ht_file_dump_listener_flush, listener);
    }

    ht_mutex_unlock(listener->mtx);
}